

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

bool __thiscall QWidgetPrivate::setMinimumSize_helper(QWidgetPrivate *this,int *minw,int *minh)

{
  bool bVar1;
  ushort uVar2;
  QWidget *pQVar3;
  char *pcVar4;
  undefined8 uVar5;
  uint *puVar6;
  pointer pQVar7;
  uint *in_RDX;
  uint *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  int mh;
  int mw;
  QWidget *q;
  char *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  uint uVar8;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  QMessageLogger *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  undefined1 uVar9;
  uint local_e8;
  uint local_e4;
  bool local_b9;
  int local_b8 [14];
  char local_80 [32];
  int local_60 [14];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(in_RDI);
  local_e4 = *in_RSI;
  local_e8 = *in_RDX;
  if (local_e4 == 0xffffff) {
    local_e4 = 0;
  }
  if (local_e8 == 0xffffff) {
    local_e8 = 0;
  }
  bVar1 = true;
  if ((int)*in_RSI < 0x1000000) {
    bVar1 = 0xffffff < (int)*in_RDX;
  }
  if (bVar1) {
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffef0,
               (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               in_stack_fffffffffffffee4,in_stack_fffffffffffffed8);
    QObject::objectName();
    QString::toLocal8Bit((QString *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    pcVar4 = QByteArray::data((QByteArray *)
                              CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    (*(code *)**(undefined8 **)pQVar3)();
    uVar5 = QMetaObject::className();
    QMessageLogger::warning
              (local_28,"QWidget::setMinimumSize: (%s/%s) The largest allowed size is (%d,%d)",
               pcVar4,uVar5,0xffffff);
    QByteArray::~QByteArray((QByteArray *)0x36a6a4);
    QString::~QString((QString *)0x36a6b1);
    local_60[1] = 0xffffff;
    puVar6 = (uint *)qMin<int>((int *)in_RSI,local_60 + 1);
    local_e4 = *puVar6;
    *in_RSI = local_e4;
    local_60[0] = 0xffffff;
    puVar6 = (uint *)qMin<int>((int *)in_RDX,local_60);
    local_e8 = *puVar6;
    *in_RDX = local_e8;
  }
  uVar9 = true;
  if (-1 < (int)*in_RSI) {
    uVar9 = (int)*in_RDX < 0;
  }
  if ((bool)uVar9 != false) {
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffef0,
               (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               in_stack_fffffffffffffee4,in_stack_fffffffffffffed8);
    QObject::objectName();
    QString::toLocal8Bit((QString *)CONCAT17(uVar9,in_stack_fffffffffffffef8));
    pcVar4 = QByteArray::data((QByteArray *)
                              CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    (*(code *)**(undefined8 **)pQVar3)();
    uVar5 = QMetaObject::className();
    QMessageLogger::warning
              (local_80,"QWidget::setMinimumSize: (%s/%s) Negative sizes (%d,%d) are not possible",
               pcVar4,uVar5,(ulong)*in_RSI,(ulong)*in_RDX);
    QByteArray::~QByteArray((QByteArray *)0x36a7cb);
    QString::~QString((QString *)0x36a7d5);
    local_b8[1] = 0;
    puVar6 = (uint *)qMax<int>((int *)in_RSI,local_b8 + 1);
    local_e4 = *puVar6;
    *in_RSI = local_e4;
    local_b8[0] = 0;
    puVar6 = (uint *)qMax<int>((int *)in_RDX,local_b8);
    local_e8 = *puVar6;
    *in_RDX = local_e8;
  }
  createExtra((QWidgetPrivate *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  pQVar7 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                     ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36a835);
  if ((pQVar7->minw == local_e4) &&
     (pQVar7 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                         ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36a84c),
     pQVar7->minh == local_e8)) {
    local_b9 = false;
  }
  else {
    uVar8 = local_e4;
    pQVar7 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36a875);
    pQVar7->minw = uVar8;
    uVar8 = local_e8;
    pQVar7 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36a892);
    pQVar7->minh = uVar8;
    uVar2 = 0;
    if (local_e8 != 0) {
      uVar2 = 2;
    }
    uVar2 = local_e4 != 0 | uVar2;
    pQVar7 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36a8cf);
    *(ushort *)&pQVar7->field_0x7c = *(ushort *)&pQVar7->field_0x7c & 0xfffc | uVar2 & 3;
    local_b9 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_b9;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetPrivate::setMinimumSize_helper(int &minw, int &minh)
{
    Q_Q(QWidget);

    int mw = minw, mh = minh;
    if (mw == QWIDGETSIZE_MAX)
        mw = 0;
    if (mh == QWIDGETSIZE_MAX)
        mh = 0;
    if (Q_UNLIKELY(minw > QWIDGETSIZE_MAX || minh > QWIDGETSIZE_MAX)) {
        qWarning("QWidget::setMinimumSize: (%s/%s) "
                "The largest allowed size is (%d,%d)",
                 q->objectName().toLocal8Bit().data(), q->metaObject()->className(), QWIDGETSIZE_MAX,
                QWIDGETSIZE_MAX);
        minw = mw = qMin<int>(minw, QWIDGETSIZE_MAX);
        minh = mh = qMin<int>(minh, QWIDGETSIZE_MAX);
    }
    if (Q_UNLIKELY(minw < 0 || minh < 0)) {
        qWarning("QWidget::setMinimumSize: (%s/%s) Negative sizes (%d,%d) "
                "are not possible",
                q->objectName().toLocal8Bit().data(), q->metaObject()->className(), minw, minh);
        minw = mw = qMax(minw, 0);
        minh = mh = qMax(minh, 0);
    }
    createExtra();
    if (extra->minw == mw && extra->minh == mh)
        return false;
    extra->minw = mw;
    extra->minh = mh;
    extra->explicitMinSize = (mw ? Qt::Horizontal : 0) | (mh ? Qt::Vertical : 0);
    return true;
}